

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_parser_t * mpc_check(mpc_parser_t *a,mpc_dtor_t da,mpc_check_t f,char *e)

{
  mpc_parser_t *pmVar1;
  size_t sVar2;
  char *__dest;
  
  pmVar1 = (mpc_parser_t *)calloc(1,0x38);
  pmVar1->name = (char *)0x0;
  pmVar1->type = '\x19';
  pmVar1->retained = '\0';
  (pmVar1->data).expect.x = a;
  (pmVar1->data).check.dx = da;
  (pmVar1->data).check.f = f;
  sVar2 = strlen(e);
  __dest = (char *)malloc(sVar2 + 1);
  (pmVar1->data).check.e = __dest;
  strcpy(__dest,e);
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_check(mpc_parser_t *a, mpc_dtor_t da, mpc_check_t f, const char *e) {
  mpc_parser_t  *p = mpc_undefined();
  p->type = MPC_TYPE_CHECK;
  p->data.check.x = a;
  p->data.check.dx = da;
  p->data.check.f = f;
  p->data.check.e = malloc(strlen(e) + 1);
  strcpy(p->data.check.e, e);
  return p;
}